

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# as-02-wrap.cpp
# Opt level: O0

CommandOptions * write_timed_text_file(CommandOptions *Options)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  ulong uVar4;
  AESEncContext *this;
  HMACContext *this_00;
  char *__s;
  reference value;
  long in_RSI;
  Result_t local_728 [104];
  _List_node_base *local_6c0;
  FrameBuffer local_6b8;
  UUID local_650;
  UUID local_630 [3];
  iterator local_5c8;
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_5c0;
  iterator local_5b8;
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_5b0;
  string local_5a8 [104];
  string local_540 [104];
  _List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor> local_4d8;
  const_iterator ri;
  string XMLDoc;
  undefined1 local_4a8 [240];
  Result_t local_3b8 [104];
  Result_t local_350 [111];
  FortunaRNG local_2e1;
  undefined1 local_2e0 [7];
  FortunaRNG RNG;
  WriterInfo Info;
  undefined1 local_1c8 [120];
  byte_t IV_buf [16];
  TimedTextDescriptor TDesc;
  FrameBuffer FrameBuffer;
  undefined1 local_48 [8];
  MXFWriter Writer;
  ST2052_TextParser Parser;
  HMACContext *HMAC;
  AESEncContext *Context;
  CommandOptions *Options_local;
  Result_t *result;
  
  AS_02::TimedText::ST2052_TextParser::ST2052_TextParser
            ((ST2052_TextParser *)&stack0xffffffffffffffc8);
  AS_02::TimedText::MXFWriter::MXFWriter((MXFWriter *)local_48);
  ASDCP::TimedText::FrameBuffer::FrameBuffer
            ((FrameBuffer *)((long)&TDesc.RFC5646LanguageTagList.field_2 + 8));
  ASDCP::TimedText::TimedTextDescriptor::TimedTextDescriptor((TimedTextDescriptor *)(IV_buf + 8));
  local_1c8[0x6f] = 0;
  std::__cxx11::
  list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::front((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)(in_RSI + 0x58));
  AS_02::TimedText::ST2052_TextParser::OpenRead((string *)Options);
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (-1 < iVar3) {
    AS_02::TimedText::ST2052_TextParser::FillTimedTextDescriptor((TimedTextDescriptor *)local_1c8);
    Kumu::Result_t::~Result_t((Result_t *)local_1c8);
    IV_buf._8_8_ = *(undefined8 *)(in_RSI + 0x18);
    TDesc.EditRate.Numerator = *(i32_t *)(in_RSI + 0x10);
    ASDCP::FrameBuffer::Capacity((int)&Info + 0xa8);
    Kumu::Result_t::~Result_t((Result_t *)&Info.LabelSetType);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) == 0) {
      std::__cxx11::string::operator=((string *)(TDesc.AssetID + 0xc),(string *)(in_RSI + 0x288));
    }
    if ((*(byte *)(in_RSI + 5) & 1) != 0) {
      fputs("IMF Timed-Text Descriptor:\n",_stderr);
      ASDCP::TimedText::DescriptorDump((TimedTextDescriptor *)(IV_buf + 8),(_IO_FILE *)0x0);
    }
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
    ASDCP::WriterInfo::WriterInfo((WriterInfo *)local_2e0,&s_MyInfo.super_WriterInfo);
    Info.ProductName.field_2._8_4_ = 2;
    if ((*(byte *)(in_RSI + 2) & 1) == 0) {
      Kumu::GenRandomUUID(Info.ProductUUID + 8);
    }
    else {
      Info.ProductUUID._8_8_ = *(undefined8 *)(in_RSI + 0x45);
      Info.AssetUUID._0_8_ = *(undefined8 *)(in_RSI + 0x4d);
    }
    if ((*(byte *)(in_RSI + 1) & 1) != 0) {
      Kumu::FortunaRNG::FortunaRNG(&local_2e1);
      Kumu::GenRandomUUID(Info.AssetUUID + 8);
      Info.CryptographicKeyID[8] = '\x01';
      if ((*(byte *)(in_RSI + 0x34) & 1) == 0) {
        create_random_uuid(Info.ContextID + 8);
      }
      else {
        Info.ContextID._8_8_ = *(undefined8 *)(in_RSI + 0x35);
        Info.CryptographicKeyID._0_8_ = *(undefined8 *)(in_RSI + 0x3d);
      }
      this = (AESEncContext *)operator_new(8);
      ASDCP::AESEncContext::AESEncContext(this);
      ASDCP::AESEncContext::InitKey((uchar *)local_350);
      Kumu::Result_t::operator=((Result_t *)Options,local_350);
      Kumu::Result_t::~Result_t(local_350);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar3) {
        Kumu::FortunaRNG::FillRandom((uchar *)&local_2e1,(int)local_1c8 + 0x70);
        ASDCP::AESEncContext::SetIVec((uchar *)local_3b8);
        Kumu::Result_t::operator=((Result_t *)Options,local_3b8);
        Kumu::Result_t::~Result_t(local_3b8);
      }
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if ((-1 < iVar3) && ((*(byte *)(in_RSI + 4) & 1) != 0)) {
        Info.CryptographicKeyID[9] = '\x01';
        this_00 = (HMACContext *)operator_new(8);
        ASDCP::HMACContext::HMACContext(this_00);
        ASDCP::HMACContext::InitKey(local_4a8 + 0x88,(LabelSet_t)this_00);
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_4a8 + 0x88));
        Kumu::Result_t::~Result_t((Result_t *)(local_4a8 + 0x88));
      }
      Kumu::FortunaRNG::~FortunaRNG(&local_2e1);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar3) {
      __s = (char *)std::__cxx11::string::c_str();
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_4a8,__s,(allocator<char> *)(XMLDoc.field_2._M_local_buf + 0xf));
      AS_02::TimedText::MXFWriter::OpenWrite
                ((string *)(local_4a8 + 0x20),(WriterInfo *)local_48,
                 (TimedTextDescriptor *)local_4a8,(uint)local_2e0);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)(local_4a8 + 0x20));
      Kumu::Result_t::~Result_t((Result_t *)(local_4a8 + 0x20));
      std::__cxx11::string::~string((string *)local_4a8);
      std::allocator<char>::~allocator((allocator<char> *)(XMLDoc.field_2._M_local_buf + 0xf));
    }
    ASDCP::WriterInfo::~WriterInfo((WriterInfo *)local_2e0);
  }
  iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
  if (iVar3 < 0) {
    local_1c8[0x6f] = 1;
    XMLDoc.field_2._8_4_ = 1;
  }
  else {
    std::__cxx11::string::string((string *)&ri);
    std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
              (&local_4d8);
    AS_02::TimedText::ST2052_TextParser::ReadTimedTextResource(local_540);
    Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_540);
    Kumu::Result_t::~Result_t((Result_t *)local_540);
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if (-1 < iVar3) {
      AS_02::TimedText::MXFWriter::WriteTimedTextResource
                (local_5a8,(AESEncContext *)local_48,(HMACContext *)&ri);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_5a8);
      Kumu::Result_t::~Result_t((Result_t *)local_5a8);
    }
    local_5b8._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
         ::begin((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                  *)((long)&TDesc.EncodingName.field_2 + 8));
    std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
              (&local_5b0,&local_5b8);
    local_4d8._M_node = local_5b0._M_node;
    while( true ) {
      local_5c8._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
           ::end((list<ASDCP::TimedText::TimedTextResourceDescriptor,_std::allocator<ASDCP::TimedText::TimedTextResourceDescriptor>_>
                  *)((long)&TDesc.EncodingName.field_2 + 8));
      std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::_List_const_iterator
                (&local_5c0,&local_5c8);
      bVar1 = std::operator!=(&local_4d8,&local_5c0);
      bVar2 = false;
      if (bVar1) {
        iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
        bVar2 = -1 < iVar3;
      }
      if (!bVar2) break;
      value = std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::operator*
                        (&local_4d8);
      Kumu::UUID::UUID(&local_650,(byte_t *)value);
      AS_02::TimedText::ST2052_TextParser::ReadAncillaryResource
                (local_630,(FrameBuffer *)&stack0xffffffffffffffc8,(IResourceResolver *)&local_650);
      Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)local_630);
      Kumu::Result_t::~Result_t((Result_t *)local_630);
      Kumu::UUID::~UUID(&local_650);
      iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
      if (-1 < iVar3) {
        if ((*(byte *)(in_RSI + 5) & 1) != 0) {
          ASDCP::TimedText::FrameBuffer::Dump
                    ((_IO_FILE *)((long)&TDesc.RFC5646LanguageTagList.field_2 + 8),(uint)_stderr);
        }
        if ((*(byte *)(in_RSI + 0xc) & 1) == 0) {
          AS_02::TimedText::MXFWriter::WriteAncillaryResource
                    (&local_6b8,(AESEncContext *)local_48,
                     (HMACContext *)(TDesc.RFC5646LanguageTagList.field_2._M_local_buf + 8));
          Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)&local_6b8);
          Kumu::Result_t::~Result_t((Result_t *)&local_6b8);
        }
      }
      bVar2 = Kumu::Result_t::operator==((Result_t *)Options,(Result_t *)Kumu::RESULT_ENDOFFILE);
      if (bVar2) {
        Kumu::Result_t::operator=((Result_t *)Options,(Result_t *)Kumu::RESULT_OK);
      }
      local_6c0 = (_List_node_base *)
                  std::_List_const_iterator<ASDCP::TimedText::TimedTextResourceDescriptor>::
                  operator++(&local_4d8,0);
    }
    iVar3 = Kumu::Result_t::operator_cast_to_int((Result_t *)Options);
    if ((-1 < iVar3) && ((*(byte *)(in_RSI + 0xc) & 1) == 0)) {
      AS_02::TimedText::MXFWriter::Finalize();
      Kumu::Result_t::operator=((Result_t *)Options,local_728);
      Kumu::Result_t::~Result_t(local_728);
    }
    local_1c8[0x6f] = 1;
    XMLDoc.field_2._8_4_ = 1;
    std::__cxx11::string::~string((string *)&ri);
  }
  if ((local_1c8[0x6f] & 1) == 0) {
    Kumu::Result_t::~Result_t((Result_t *)Options);
  }
  ASDCP::TimedText::TimedTextDescriptor::~TimedTextDescriptor((TimedTextDescriptor *)(IV_buf + 8));
  ASDCP::TimedText::FrameBuffer::~FrameBuffer
            ((FrameBuffer *)((long)&TDesc.RFC5646LanguageTagList.field_2 + 8));
  AS_02::TimedText::MXFWriter::~MXFWriter((MXFWriter *)local_48);
  AS_02::TimedText::ST2052_TextParser::~ST2052_TextParser
            ((ST2052_TextParser *)&stack0xffffffffffffffc8);
  return Options;
}

Assistant:

Result_t
write_timed_text_file(CommandOptions& Options)
{
  AESEncContext*    Context = 0;
  HMACContext*      HMAC = 0;
  AS_02::TimedText::ST2052_TextParser  Parser;
  AS_02::TimedText::MXFWriter    Writer;
  TimedText::FrameBuffer  FrameBuffer;
  TimedText::TimedTextDescriptor TDesc;
  byte_t            IV_buf[CBC_BLOCK_SIZE];

  // set up essence parser
  Result_t result = Parser.OpenRead(Options.filenames.front());

  // set up MXF writer
  if ( ASDCP_SUCCESS(result) )
    {
      Parser.FillTimedTextDescriptor(TDesc);
      TDesc.EditRate = Options.edit_rate;
      TDesc.ContainerDuration = Options.duration;
      FrameBuffer.Capacity(Options.fb_size);

      if ( ! Options.profile_name.empty() )
	{
	  TDesc.NamespaceName = Options.profile_name;
	}

      if ( Options.verbose_flag )
	{
	  fputs("IMF Timed-Text Descriptor:\n", stderr);
	  TimedText::DescriptorDump(TDesc);
	}
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    {
      WriterInfo Info = s_MyInfo;  // fill in your favorite identifiers here
      Info.LabelSetType = LS_MXF_SMPTE;

      if ( Options.asset_id_flag )
	memcpy(Info.AssetUUID, Options.asset_id_value, UUIDlen);
      else
	Kumu::GenRandomUUID(Info.AssetUUID);

#ifdef HAVE_OPENSSL
      // configure encryption
      if( Options.key_flag )
	{
      Kumu::FortunaRNG  RNG;
	  Kumu::GenRandomUUID(Info.ContextID);
	  Info.EncryptedEssence = true;

	  if ( Options.key_id_flag )
	    {
	      memcpy(Info.CryptographicKeyID, Options.key_id_value, UUIDlen);
	    }
	  else
	    {
	      create_random_uuid(Info.CryptographicKeyID);
	    }

	  Context = new AESEncContext;
	  result = Context->InitKey(Options.key_value);

	  if ( ASDCP_SUCCESS(result) )
	    result = Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));

	  if ( ASDCP_SUCCESS(result) && Options.write_hmac )
	    {
	      Info.UsesHMAC = true;
	      HMAC = new HMACContext;
	      result = HMAC->InitKey(Options.key_value, Info.LabelSetType);
	    }
	}
#endif // HAVE_OPENSSL

      if ( ASDCP_SUCCESS(result) )
	result = Writer.OpenWrite(Options.out_file.c_str(), Info, TDesc);
    }

  if ( ASDCP_FAILURE(result) )
    return result;

  std::string XMLDoc;
  TimedText::ResourceList_t::const_iterator ri;

  result = Parser.ReadTimedTextResource(XMLDoc);

  if ( ASDCP_SUCCESS(result) )
    result = Writer.WriteTimedTextResource(XMLDoc, Context, HMAC);

  for ( ri = TDesc.ResourceList.begin() ; ri != TDesc.ResourceList.end() && ASDCP_SUCCESS(result); ri++ )
    {
      result = Parser.ReadAncillaryResource((*ri).ResourceID, FrameBuffer);

      if ( ASDCP_SUCCESS(result) )
	{
	  if ( Options.verbose_flag )
	    FrameBuffer.Dump(stderr, Options.fb_dump_size);

	  if ( ! Options.no_write_flag )
	    {
	      result = Writer.WriteAncillaryResource(FrameBuffer, Context, HMAC);

	      // The Writer class will forward the last block of ciphertext
	      // to the encryption context for use as the IV for the next
	      // frame. If you want to use non-sequitur IV values, un-comment
	      // the following  line of code.
	      // if ( ASDCP_SUCCESS(result) && Options.key_flag )
	      //   Context->SetIVec(RNG.FillRandom(IV_buf, CBC_BLOCK_SIZE));
	    }
	}

      if ( result == RESULT_ENDOFFILE )
	result = RESULT_OK;
    }

  if ( ASDCP_SUCCESS(result) && ! Options.no_write_flag )
    result = Writer.Finalize();

  return result;
}